

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintCharAndCodeTo<unsigned_char>(uchar c,ostream *os)

{
  undefined4 uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  bool bVar4;
  uint32_t value;
  long lVar5;
  char *pcVar6;
  undefined7 in_register_00000039;
  ulong uVar7;
  int iVar8;
  string local_40;
  
  uVar7 = CONCAT71(in_register_00000039,c);
  std::__ostream_insert<char,std::char_traits<char>>(os,"",0);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  iVar8 = (int)uVar7;
  switch(uVar7 & 0xffffffff) {
  case 0:
    pcVar6 = "\\0";
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_00168aac_caseD_1:
    if (0x5e < iVar8 - 0x20U) {
      uVar1 = *(undefined4 *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\\x",2);
      pp_Var2 = os->_vptr_basic_ostream;
      p_Var3 = pp_Var2[-3];
      *(uint *)(&os->field_0x18 + (long)p_Var3) =
           *(uint *)(&os->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
      *(uint *)(&os->field_0x18 + (long)pp_Var2[-3]) =
           *(uint *)(&os->field_0x18 + (long)pp_Var2[-3]) | 0x4000;
      std::ostream::operator<<(os,iVar8);
      *(undefined4 *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) = uVar1;
      bVar4 = true;
      goto LAB_00168b3f;
    }
    pcVar6 = (char *)&local_40;
    lVar5 = 1;
    local_40._M_dataplus._M_p._0_1_ = c;
    goto LAB_00168b34;
  case 7:
    pcVar6 = "\\a";
    break;
  case 8:
    pcVar6 = "\\b";
    break;
  case 9:
    pcVar6 = "\\t";
    break;
  case 10:
    pcVar6 = "\\n";
    break;
  case 0xb:
    pcVar6 = "\\v";
    break;
  case 0xc:
    pcVar6 = "\\f";
    break;
  case 0xd:
    pcVar6 = "\\r";
    break;
  default:
    if (iVar8 == 0x27) {
      pcVar6 = "\\\'";
    }
    else {
      if (iVar8 != 0x5c) goto switchD_00168aac_caseD_1;
      pcVar6 = "\\\\";
    }
  }
  lVar5 = 2;
LAB_00168b34:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar5);
  bVar4 = false;
LAB_00168b3f:
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  if (c != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    std::ostream::operator<<(os,iVar8);
    if (9 < c && !bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", 0x",4);
      String::FormatHexUInt32_abi_cxx11_(&local_40,(String *)(uVar7 & 0xffffffff),value);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                     (uchar)local_40._M_dataplus._M_p),local_40._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(uchar)local_40._M_dataplus._M_p) !=
          &local_40.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_40._M_dataplus._M_p._1_7_,(uchar)local_40._M_dataplus._M_p),
                        local_40.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << GetCharWidthPrefix(c) << "'";
  const CharFormat format = PrintAsCharLiteralTo(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexadecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<int>(c));
  }
  *os << ")";
}